

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

SIMDShuffle * __thiscall MixedArena::alloc<wasm::SIMDShuffle>(MixedArena *this)

{
  SIMDShuffle *pSVar1;
  
  pSVar1 = (SIMDShuffle *)allocSpace(this,0x30,8);
  *(undefined8 *)&(pSVar1->super_SpecificExpression<(wasm::Expression::Id)31>).super_Expression = 0;
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)31>).super_Expression.type.id = 0;
  pSVar1->left = (Expression *)0x0;
  pSVar1->right = (Expression *)0x0;
  (pSVar1->mask)._M_elems[0] = '\0';
  (pSVar1->mask)._M_elems[1] = '\0';
  (pSVar1->mask)._M_elems[2] = '\0';
  (pSVar1->mask)._M_elems[3] = '\0';
  (pSVar1->mask)._M_elems[4] = '\0';
  (pSVar1->mask)._M_elems[5] = '\0';
  (pSVar1->mask)._M_elems[6] = '\0';
  (pSVar1->mask)._M_elems[7] = '\0';
  (pSVar1->mask)._M_elems[8] = '\0';
  (pSVar1->mask)._M_elems[9] = '\0';
  (pSVar1->mask)._M_elems[10] = '\0';
  (pSVar1->mask)._M_elems[0xb] = '\0';
  (pSVar1->mask)._M_elems[0xc] = '\0';
  (pSVar1->mask)._M_elems[0xd] = '\0';
  (pSVar1->mask)._M_elems[0xe] = '\0';
  (pSVar1->mask)._M_elems[0xf] = '\0';
  (pSVar1->super_SpecificExpression<(wasm::Expression::Id)31>).super_Expression._id = SIMDShuffleId;
  return pSVar1;
}

Assistant:

T* alloc() {
    static_assert(alignof(T) <= MAX_ALIGN,
                  "maximum alignment not large enough");
    auto* ret = static_cast<T*>(allocSpace(sizeof(T), alignof(T)));
    new (ret) T(*this); // allocated objects receive the allocator, so they can
                        // allocate more later if necessary
    return ret;
  }